

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O3

void __thiscall HashUtil_Ripemd160_Test::TestBody(HashUtil_Ripemd160_Test *this)

{
  pointer *ppuVar1;
  pointer puVar2;
  bool bVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  Pubkey local_b8;
  string local_98;
  Script local_70;
  ByteData160 local_38;
  
  cfd::core::ByteData160::ByteData160(&local_38);
  ppuVar1 = (pointer *)
            ((long)&local_70.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_70._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"0123456789abcdef","");
  cfd::core::ByteData::ByteData(&local_b8.data_,(string *)&local_70);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_98,&local_b8.data_);
  puVar2 = local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_98._M_dataplus._M_p;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_98._M_string_length;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_98.field_2._M_allocated_capacity;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if ((pointer)local_98._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_70._vptr_Script);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_70,&local_38);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_98,"byte_data.GetHex().c_str()",
             "\"cea1b21f1a739fba68d1d4290437d2c5609be1d3\"",(char *)local_70._vptr_Script,
             "cea1b21f1a739fba68d1d4290437d2c5609be1d3");
  if (local_70._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_70._vptr_Script);
  }
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((pointer)local_98._M_string_length == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x27,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_70._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_70._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"0123456789abcdef0123456789abcdef01234567","");
  cfd::core::ByteData160::ByteData160((ByteData160 *)&local_b8,(string *)&local_70);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_98,(ByteData160 *)&local_b8);
  puVar2 = local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_98._M_dataplus._M_p;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_98._M_string_length;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_98.field_2._M_allocated_capacity;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if ((pointer)local_98._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_70._vptr_Script);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_70,&local_38);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_98,"byte_data.GetHex().c_str()",
             "\"49ec9207a365f6f330d529ca2a79e23a7ea2b526\"",(char *)local_70._vptr_Script,
             "49ec9207a365f6f330d529ca2a79e23a7ea2b526");
  if (local_70._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_70._vptr_Script);
  }
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((pointer)local_98._M_string_length == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x2a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_70._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_70._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"1234567890123456789012345678901234567890123456789012345678901234",
             "");
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_b8,(string *)&local_70);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_98,(ByteData256 *)&local_b8);
  puVar2 = local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_98._M_dataplus._M_p;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_98._M_string_length;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_98.field_2._M_allocated_capacity;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if ((pointer)local_98._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_70._vptr_Script);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_70,&local_38);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_98,"byte_data.GetHex().c_str()",
             "\"a5b1c86f10c81c3c543304e9891815d8de036296\"",(char *)local_70._vptr_Script,
             "a5b1c86f10c81c3c543304e9891815d8de036296");
  if (local_70._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_70._vptr_Script);
  }
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((pointer)local_98._M_string_length == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x2d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_70._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_70._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db","");
  cfd::core::Pubkey::Pubkey(&local_b8,(string *)&local_70);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_98,&local_b8);
  puVar2 = local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_98._M_dataplus._M_p;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_98._M_string_length;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_98.field_2._M_allocated_capacity;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if (local_98._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_70._vptr_Script);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_70,&local_38);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_98,"byte_data.GetHex().c_str()",
             "\"1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca\"",(char *)local_70._vptr_Script,
             "1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca");
  if (local_70._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_70._vptr_Script);
  }
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x30,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_70._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_70._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"
             ,"");
  cfd::core::Script::Script(&local_70,&local_98);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_b8,&local_70);
  puVar2 = local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  cfd::core::Script::~Script(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_70,&local_38);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_98,"byte_data.GetHex().c_str()",
             "\"6be854f95bade5490a020c3841c50d08339a5c89\"",(char *)local_70._vptr_Script,
             "6be854f95bade5490a020c3841c50d08339a5c89");
  if (local_70._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_70._vptr_Script);
  }
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x33,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_70._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_70._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HashUtil, Ripemd160) {
  ByteData160 byte_data;
  byte_data = HashUtil::Ripemd160(ByteData("0123456789abcdef"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "cea1b21f1a739fba68d1d4290437d2c5609be1d3");

  byte_data = HashUtil::Ripemd160(ByteData160("0123456789abcdef0123456789abcdef01234567"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "49ec9207a365f6f330d529ca2a79e23a7ea2b526");

  byte_data = HashUtil::Ripemd160(ByteData256("1234567890123456789012345678901234567890123456789012345678901234"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "a5b1c86f10c81c3c543304e9891815d8de036296");

  byte_data = HashUtil::Ripemd160(Pubkey("032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca");

  byte_data = HashUtil::Ripemd160(Script("21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "6be854f95bade5490a020c3841c50d08339a5c89");
}